

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int wally_aes_cbc(uchar *key,size_t key_len,uchar *iv,size_t iv_len,uchar *bytes,size_t bytes_len,
                 uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  _Bool _Var1;
  uchar *local_178;
  uchar *prev;
  uchar *last;
  ulong uStack_160;
  uchar remainder;
  size_t blocks;
  size_t n;
  size_t i;
  AES256_ctx ctx;
  uchar buf [16];
  size_t bytes_len_local;
  uchar *bytes_local;
  size_t iv_len_local;
  uchar *iv_local;
  size_t key_len_local;
  uchar *key_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  _Var1 = are_valid_args(key,key_len,bytes,bytes_len,flags);
  if ((((_Var1) && (((flags & 1) == 0 || ((len & 0xf) == 0)))) &&
      (((flags & 2) == 0 || ((bytes_len & 0xf) == 0)))) &&
     ((((iv != (uchar *)0x0 && (iv_len == 0x10)) && ((flags & 0xfffffffc) == 0)) &&
      (written != (size_t *)0x0)))) {
    uStack_160 = bytes_len >> 4;
    if ((flags & 1) == 0) {
      local_178 = bytes + (bytes_len - 0x20);
      uStack_160 = uStack_160 - 1;
      if (uStack_160 == 0) {
        local_178 = iv;
      }
      aes_dec((AES256_ctx *)&i,key,key_len,bytes + (bytes_len - 0x10),0x10,
              (uchar *)(ctx.rk[0xe].slice + 4));
      for (blocks = 0; blocks < 0x10; blocks = blocks + 1) {
        buf[blocks - 8] = local_178[blocks] ^ buf[blocks - 8];
      }
      last._7_1_ = 0x10 - buf[7] % 0x10;
      if (last._7_1_ == 0x10) {
        last._7_1_ = 0;
      }
      *written = uStack_160 * 0x10 + (ulong)last._7_1_;
    }
    else {
      last._7_1_ = (byte)bytes_len & 0xf;
      *written = (uStack_160 + 1) * 0x10;
    }
    if ((*written <= len) && (*written != 0)) {
      if (bytes_out == (uchar *)0x0) {
        wally_clear_2(ctx.rk[0xe].slice + 4,0x10,&i,0xf0);
        return -2;
      }
      if ((flags & 2) != 0) {
        memcpy(bytes_out + uStack_160 * 0x10,ctx.rk[0xe].slice + 4,(ulong)last._7_1_);
      }
      bytes_len_local = (size_t)bytes;
      iv_len_local = (size_t)iv;
      for (n = 0; n < uStack_160; n = n + 1) {
        if ((flags & 1) == 0) {
          aes_dec((AES256_ctx *)&i,key,key_len,(uchar *)bytes_len_local,0x10,bytes_out);
          for (blocks = 0; blocks < 0x10; blocks = blocks + 1) {
            bytes_out[blocks] = bytes_out[blocks] ^ *(byte *)(iv_len_local + blocks);
          }
          iv_len_local = bytes_len_local;
        }
        else {
          for (blocks = 0; blocks < 0x10; blocks = blocks + 1) {
            buf[blocks - 8] = *(byte *)(bytes_len_local + blocks) ^ *(byte *)(iv_len_local + blocks)
            ;
          }
          aes_enc((AES256_ctx *)&i,key,key_len,(uchar *)(ctx.rk[0xe].slice + 4),0x10,bytes_out);
          iv_len_local = (size_t)bytes_out;
        }
        bytes_len_local = bytes_len_local + 0x10;
        bytes_out = bytes_out + 0x10;
      }
      if ((flags & 1) != 0) {
        for (blocks = 0; blocks < last._7_1_; blocks = blocks + 1) {
          buf[blocks - 8] = *(byte *)(bytes_len_local + blocks) ^ *(byte *)(iv_len_local + blocks);
        }
        for (; blocks < 0x10; blocks = blocks + 1) {
          buf[blocks - 8] = 0x10 - last._7_1_ ^ *(byte *)(iv_len_local + blocks);
        }
        aes_enc((AES256_ctx *)&i,key,key_len,(uchar *)(ctx.rk[0xe].slice + 4),0x10,bytes_out);
      }
    }
    wally_clear_2(ctx.rk[0xe].slice + 4,0x10,&i,0xf0);
    key_local._4_4_ = 0;
  }
  else {
    key_local._4_4_ = -2;
  }
  return key_local._4_4_;
}

Assistant:

int wally_aes_cbc(const unsigned char *key, size_t key_len,
                  const unsigned char *iv, size_t iv_len,
                  const unsigned char *bytes, size_t bytes_len,
                  uint32_t flags,
                  unsigned char *bytes_out, size_t len,
                  size_t *written)
{
    unsigned char buf[AES_BLOCK_LEN];
    AES256_ctx ctx;
    size_t i, n, blocks;
    unsigned char remainder;

    if (written)
        *written = 0;

    if (!are_valid_args(key, key_len, bytes, bytes_len, flags) ||
        ((flags & AES_FLAG_ENCRYPT) && (len % AES_BLOCK_LEN)) ||
        ((flags & AES_FLAG_DECRYPT) && (bytes_len % AES_BLOCK_LEN)) ||
        !iv || iv_len != AES_BLOCK_LEN || flags & ~ALL_OPS || !written)
        return WALLY_EINVAL;

    blocks = bytes_len / AES_BLOCK_LEN;

    if (flags & AES_FLAG_ENCRYPT) {
        /* Determine output length from input length */
        remainder = bytes_len % AES_BLOCK_LEN;
        *written = (blocks + 1) * AES_BLOCK_LEN;
    } else {
        /* Determine output length from decrypted final block */
        const unsigned char *last = bytes + bytes_len - AES_BLOCK_LEN;
        const unsigned char *prev = last - AES_BLOCK_LEN;

        if (!--blocks)
            prev = iv;
        aes_dec(&ctx, key, key_len, last, AES_BLOCK_LEN, buf);
        for (n = 0; n < AES_BLOCK_LEN; ++n)
            buf[n] = prev[n] ^ buf[n];

        /* Modulo the resulting padding amount to the block size - we do
         * not attempt to verify the decryption by checking the padding in
         * the decrypted block. */
        remainder = AES_BLOCK_LEN - (buf[AES_BLOCK_LEN - 1] % AES_BLOCK_LEN);
        if (remainder == AES_BLOCK_LEN)
            remainder = 0;
        *written = blocks * AES_BLOCK_LEN + remainder;
    }
    if (len < *written || !*written)
        goto finish; /* Inform caller how much space is needed */

    if (!bytes_out) {
        wally_clear_2(buf, sizeof(buf), &ctx, sizeof(ctx));
        return WALLY_EINVAL;
    }

    if (flags & AES_FLAG_DECRYPT)
        memcpy(bytes_out + blocks * AES_BLOCK_LEN, buf, remainder);

    for (i = 0; i < blocks; ++i) {
        if (flags & AES_FLAG_ENCRYPT) {
            for (n = 0; n < AES_BLOCK_LEN; ++n)
                buf[n] = bytes[n] ^ iv[n];
            aes_enc(&ctx, key, key_len, buf, AES_BLOCK_LEN, bytes_out);
            iv = bytes_out;
        } else {
            aes_dec(&ctx, key, key_len, bytes, AES_BLOCK_LEN, bytes_out);
            for (n = 0; n < AES_BLOCK_LEN; ++n)
                bytes_out[n] = bytes_out[n] ^ iv[n];
            iv = bytes;
        }
        bytes += AES_BLOCK_LEN;
        bytes_out += AES_BLOCK_LEN;
    }

    if (flags & AES_FLAG_ENCRYPT) {
        for (n = 0; n < remainder; ++n)
            buf[n] = bytes[n] ^ iv[n];
        remainder = 16 - remainder;
        for (; n < AES_BLOCK_LEN; ++n)
            buf[n] = remainder ^ iv[n];
        aes_enc(&ctx, key, key_len, buf, AES_BLOCK_LEN, bytes_out);
    }

finish:
    wally_clear_2(buf, sizeof(buf), &ctx, sizeof(ctx));
    return WALLY_OK;
}